

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vector.h
# Opt level: O3

void __thiscall
crnlib::vector<crnlib::dynamic_string>::~vector(vector<crnlib::dynamic_string> *this)

{
  uint uVar1;
  long lVar2;
  dynamic_string *p;
  long lVar3;
  
  p = this->m_p;
  if (p != (dynamic_string *)0x0) {
    uVar1 = this->m_size;
    if ((ulong)uVar1 != 0) {
      lVar3 = 0;
      do {
        lVar2 = *(long *)((long)&p->m_pStr + lVar3);
        if ((lVar2 != 0) && ((*(uint *)(lVar2 + -8) ^ *(uint *)(lVar2 + -4)) == 0xffffffff)) {
          crnlib_free((void *)(lVar2 + -0x10));
        }
        lVar3 = lVar3 + 0x10;
      } while ((ulong)uVar1 << 4 != lVar3);
      p = this->m_p;
    }
    crnlib_free(p);
  }
  return;
}

Assistant:

inline ~vector()
        {
            if (m_p)
            {
                scalar_type<T>::destruct_array(m_p, m_size);
                crnlib_free(m_p);
            }
        }